

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean HTS_dp_match(char *string,char *pattern,size_t pos,size_t max)

{
  char cVar1;
  char cVar2;
  HTS_Boolean HVar3;
  
  if (max < pos) {
LAB_0014b878:
    HVar3 = '\0';
  }
  else {
    cVar1 = *string;
    while( true ) {
      cVar2 = *pattern;
      HVar3 = '\x01';
      if (cVar1 == '\0' && cVar2 == '\0') break;
      if (cVar2 != '*') {
        if ((cVar1 == cVar2 || cVar2 == '?') &&
           (HVar3 = HTS_dp_match(string + 1,pattern + 1,pos + 1,max + 1), HVar3 != '\0')) {
          return '\x01';
        }
        goto LAB_0014b878;
      }
      HVar3 = HTS_dp_match(string + 1,pattern,pos + 1,max);
      if (HVar3 != '\0') {
        return '\x01';
      }
      pattern = pattern + 1;
    }
  }
  return HVar3;
}

Assistant:

static HTS_Boolean HTS_dp_match(const char *string, const char *pattern, size_t pos, size_t max)
{
   if (pos > max)
      return FALSE;
   if (string[0] == '\0' && pattern[0] == '\0')
      return TRUE;
   if (pattern[0] == '*') {
      if (HTS_dp_match(string + 1, pattern, pos + 1, max) == 1)
         return TRUE;
      else
         return HTS_dp_match(string, pattern + 1, pos, max);
   }
   if (string[0] == pattern[0] || pattern[0] == '?') {
      if (HTS_dp_match(string + 1, pattern + 1, pos + 1, max + 1) == 1)
         return TRUE;
   }

   return FALSE;
}